

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_server.cpp
# Opt level: O1

void StatusServerHandler(CManager cm,CMConnection conn,void *vevent,void *client_data,
                        attr_list attrs)

{
  ostream *poVar1;
  _StatusResponseMsg status_response_msg;
  stringstream Status;
  char hostbuffer [256];
  ulong local_308;
  char *pcStack_300;
  char *local_2f8;
  string local_2f0;
  string local_2d0;
  stringstream local_2b0 [16];
  ostream local_2a0 [112];
  ios_base local_230 [264];
  char local_128 [264];
  
  gethostname(local_128,0x100);
  local_2f8 = (char *)0x0;
  local_308 = (ulong)*vevent;
  pcStack_300 = local_128;
  std::__cxx11::stringstream::stringstream(local_2b0);
  std::__ostream_insert<char,std::char_traits<char>>(local_2a0,"ADIOS files Opened: ",0x14);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_2a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," (",2);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," gets for ",10);
  readable_size_abi_cxx11_(&local_2f0,TotalGetBytesSent);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_2f0._M_dataplus._M_p,local_2f0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")  Simple files opened: ",0x18);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," (",2);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," reads for ",0xb);
  readable_size_abi_cxx11_(&local_2d0,TotalSimpleBytesSent);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_2d0._M_dataplus._M_p,local_2d0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p);
  }
  std::__cxx11::stringbuf::str();
  local_2f8 = strdup(local_2f0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p);
  }
  CMwrite(conn,*(undefined8 *)((long)client_data + 0x60),&local_308);
  free(local_2f8);
  std::__cxx11::stringstream::~stringstream(local_2b0);
  std::ios_base::~ios_base(local_230);
  return;
}

Assistant:

static void StatusServerHandler(CManager cm, CMConnection conn, void *vevent, void *client_data,
                                attr_list attrs)
{
    StatusServerMsg status_msg = static_cast<StatusServerMsg>(vevent);
    struct Remote_evpath_state *ev_state = static_cast<struct Remote_evpath_state *>(client_data);
    _StatusResponseMsg status_response_msg;
    char hostbuffer[256];

    // To retrieve hostname
    gethostname(hostbuffer, sizeof(hostbuffer));
    memset(&status_response_msg, 0, sizeof(status_response_msg));
    status_response_msg.StatusResponseCondition = status_msg->StatusResponseCondition;
    status_response_msg.Hostname = &hostbuffer[0];
    std::stringstream Status;
    Status << "ADIOS files Opened: " << ADIOSFilesOpened << " (" << TotalGets << " gets for "
           << readable_size(TotalGetBytesSent) << ")  Simple files opened: " << SimpleFilesOpened
           << " (" << TotalSimpleReads << " reads for " << readable_size(TotalSimpleBytesSent)
           << ")";
    status_response_msg.Status = strdup(Status.str().c_str());
    CMwrite(conn, ev_state->StatusResponseFormat, &status_response_msg);
    free(status_response_msg.Status);
}